

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cc
# Opt level: O0

ssize_t __thiscall pstack::CacheReader::read(CacheReader *this,int __fd,void *__buf,size_t __nbytes)

{
  Off __dest;
  int iVar1;
  element_type *peVar2;
  undefined4 extraout_var;
  unsigned_long *puVar3;
  pointer pvVar4;
  undefined4 in_register_00000034;
  Exception *e;
  size_t local_68;
  size_t chunk;
  Page *local_50;
  Page *page;
  Off offsetOfPageInFile;
  size_t offsetOfDataInPage;
  Off startoff;
  char *ptr_local;
  size_t count_local;
  Off off_local;
  CacheReader *this_local;
  
  offsetOfDataInPage = CONCAT44(in_register_00000034,__fd);
  startoff = __nbytes;
  ptr_local = (char *)__buf;
  count_local = offsetOfDataInPage;
  off_local = (Off)this;
  if (__buf < (void *)0x100) {
    do {
      if (ptr_local == (char *)0x0) break;
      offsetOfPageInFile = count_local & 0xff;
      page = (Page *)(count_local - offsetOfPageInFile);
      local_50 = getPage(this,(Off)page);
      e = (Exception *)(local_50->len - offsetOfPageInFile);
      puVar3 = std::min<unsigned_long>((unsigned_long *)&e,(unsigned_long *)&ptr_local);
      __dest = startoff;
      local_68 = *puVar3;
      pvVar4 = std::array<char,_256UL>::data(&local_50->data);
      memcpy((void *)__dest,pvVar4 + offsetOfPageInFile,local_68);
      count_local = local_68 + count_local;
      ptr_local = ptr_local + -local_68;
      startoff = local_68 + startoff;
    } while (local_50->len == 0x100);
    this_local = (CacheReader *)(count_local - offsetOfDataInPage);
  }
  else {
    peVar2 = std::
             __shared_ptr_access<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->upstream);
    iVar1 = (*peVar2->_vptr_Reader[2])(peVar2,count_local,ptr_local,startoff);
    this_local = (CacheReader *)CONCAT44(extraout_var,iVar1);
  }
  return (ssize_t)this_local;
}

Assistant:

size_t
CacheReader::read(Off off, size_t count, char *ptr) const
{
    if (count >= PAGESIZE)
        return upstream->read(off, count, ptr);
    Off startoff = off;
    for (;;) {
        if (count == 0)
            break;
        size_t offsetOfDataInPage = off % PAGESIZE;
        Off offsetOfPageInFile = off - offsetOfDataInPage;
        try {
           Page &page = getPage(offsetOfPageInFile);
           size_t chunk = std::min(page.len - offsetOfDataInPage, count);
           memcpy(ptr, page.data.data() + offsetOfDataInPage, chunk);
           off += chunk;
           count -= chunk;
           ptr += chunk;
           if (page.len != PAGESIZE)
               break;
        }
        catch (const Exception &e) {
           break;
        }
    }
    return off - startoff;
}